

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupAndOr(Gia_Man_t *p,int nOuts,int fUseOr,int fCompl)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  bool bVar8;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xb27,"Gia_Man_t *Gia_ManDupAndOr(Gia_Man_t *, int, int, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  for (iVar7 = 0; iVar7 < p->vCis->nSize - p->nRegs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCi(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar1;
  }
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManObj(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      uVar1 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      pGVar5->Value = uVar1;
    }
  }
  if (fUseOr == 0) {
    iVar7 = 1;
    for (iVar2 = 0; iVar2 < p->vCos->nSize - p->nRegs; iVar2 = iVar2 + 1) {
      pGVar5 = Gia_ManCo(p,iVar2);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      iVar3 = Gia_ObjFanin0Copy(pGVar5);
      iVar7 = Gia_ManHashAnd(p_00,iVar7,iVar3);
    }
  }
  else {
    iVar7 = 0;
    for (iVar2 = 0; iVar2 < p->vCos->nSize - p->nRegs; iVar2 = iVar2 + 1) {
      pGVar5 = Gia_ManCo(p,iVar2);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      iVar3 = Gia_ObjFanin0Copy(pGVar5);
      iVar7 = Gia_ManHashOr(p_00,iVar7,iVar3);
    }
  }
  iVar2 = Abc_LitNotCond(iVar7,(uint)(0 < fCompl));
  iVar7 = 0;
  if (0 < nOuts) {
    iVar7 = nOuts;
  }
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    Gia_ManAppendCo(p_00,iVar2);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupAndOr( Gia_Man_t * p, int nOuts, int fUseOr, int fCompl )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iResult;
    assert( Gia_ManRegNum(p) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( fUseOr ) // construct OR of all POs
    {
        iResult = 0;
        Gia_ManForEachPo( p, pObj, i )
            iResult = Gia_ManHashOr( pNew, iResult, Gia_ObjFanin0Copy(pObj) );
    }
    else // construct AND of all POs
    {
        iResult = 1;
        Gia_ManForEachPo( p, pObj, i )
            iResult = Gia_ManHashAnd( pNew, iResult, Gia_ObjFanin0Copy(pObj) );
    }
    iResult = Abc_LitNotCond( iResult, (int)(fCompl > 0) );
//    Gia_ManForEachPo( p, pObj, i )
//        pObj->Value = Gia_ManAppendCo( pNew, iResult );
    for ( i = 0; i < nOuts; i++ )
        Gia_ManAppendCo( pNew, iResult );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}